

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall cmTarget::ClearDependencyInformation(cmTarget *this,cmMakefile *mf,string *target)

{
  pointer pcVar1;
  char *pcVar2;
  string message;
  string depname;
  long *local_68 [2];
  long local_58 [2];
  string local_48;
  
  pcVar1 = (target->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + target->_M_string_length);
  std::__cxx11::string::append((char *)&local_48);
  if (this->RecordDependencies == true) {
    cmMakefile::AddCacheDefinition(mf,&local_48,"","Dependencies for target",STATIC,false);
  }
  else {
    pcVar2 = cmMakefile::GetDefinition(mf,&local_48);
    if (pcVar2 != (char *)0x0) {
      local_68[0] = local_58;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Target ","");
      std::__cxx11::string::_M_append((char *)local_68,(ulong)(target->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)local_68);
      std::__cxx11::string::append((char *)local_68);
      std::__cxx11::string::_M_append((char *)local_68,(ulong)local_48._M_dataplus._M_p);
      std::__cxx11::string::append((char *)local_68);
      cmSystemTools::Error((char *)local_68[0],(char *)0x0,(char *)0x0,(char *)0x0);
      if (local_68[0] != local_58) {
        operator_delete(local_68[0],local_58[0] + 1);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmTarget::ClearDependencyInformation(cmMakefile& mf,
                                          const std::string& target)
{
  // Clear the dependencies. The cache variable must exist iff we are
  // recording dependency information for this target.
  std::string depname = target;
  depname += "_LIB_DEPENDS";
  if (this->RecordDependencies) {
    mf.AddCacheDefinition(depname, "", "Dependencies for target",
                          cmStateEnums::STATIC);
  } else {
    if (mf.GetDefinition(depname)) {
      std::string message = "Target ";
      message += target;
      message += " has dependency information when it shouldn't.\n";
      message += "Your cache is probably stale. Please remove the entry\n  ";
      message += depname;
      message += "\nfrom the cache.";
      cmSystemTools::Error(message.c_str());
    }
  }
}